

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_find(jit_State *J,RecordFFData *rd)

{
  RecordFFData *pRVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  TRef TVar4;
  int iVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  char *pcVar9;
  TRef pos;
  TRef trp0;
  TRef tr;
  TRef trplen;
  TRef trslen;
  TRef trpptr;
  TRef trsptr;
  int32_t start;
  GCstr *pat;
  GCstr *str;
  TRef local_108;
  TRef trstart;
  TRef tr0;
  TRef trlen;
  TRef trpat;
  TRef trstr;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_e0;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined2 local_d2;
  RecordFFData *local_d0;
  undefined2 local_c6;
  undefined2 local_c4;
  undefined2 local_c2;
  RecordFFData *local_c0;
  undefined2 local_b6;
  undefined2 local_b4;
  undefined2 local_b2;
  RecordFFData *local_b0;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  RecordFFData *local_a0;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  RecordFFData *local_90;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  RecordFFData *local_80;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  RecordFFData *local_70;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  RecordFFData *local_60;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  RecordFFData *local_50;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  RecordFFData *local_40;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  RecordFFData *local_30;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  RecordFFData *local_20;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  RecordFFData *local_10;
  
  _trpat = rd;
  rd_local = (RecordFFData *)J;
  trlen = lj_ir_tostr(J,*J->base);
  tr0 = lj_ir_tostr((jit_State *)rd_local,*(TRef *)(*(long *)&rd_local[6].data + 4));
  local_10 = rd_local;
  local_12 = 0x4513;
  local_14 = (undefined2)trlen;
  local_16 = 0;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x4513;
  *(undefined2 *)&rd_local[7].data = local_14;
  *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
  trstart = lj_opt_fold((jit_State *)rd_local);
  local_108 = lj_ir_kint((jit_State *)rd_local,0);
  pat = argv2str((jit_State *)rd_local,_trpat->argv);
  _trsptr = (GCobj *)argv2str((jit_State *)rd_local,_trpat->argv + 1);
  *(undefined1 *)((long)&rd_local[7].nres + 5) = 1;
  if ((*(uint *)(*(long *)&rd_local[6].data + 8) & 0x1f000000) == 0) {
    str._4_4_ = lj_ir_kint((jit_State *)rd_local,1);
    trpptr = 1;
  }
  else {
    str._4_4_ = lj_opt_narrow_toint((jit_State *)rd_local,*(TRef *)(*(long *)&rd_local[6].data + 8))
    ;
    trpptr = argv2int((jit_State *)rd_local,_trpat->argv + 2);
  }
  str._4_4_ = recff_string_start((jit_State *)rd_local,pat,(int32_t *)&trpptr,str._4_4_,trstart,
                                 local_108);
  uVar3 = (undefined2)str._4_4_;
  uVar2 = (undefined2)trstart;
  if (pat->len < trpptr) {
    local_30 = rd_local;
    local_32 = 0x793;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x793;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = uVar2;
    local_36 = uVar2;
    local_34 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    str._4_4_ = trstart;
    trpptr = pat->len;
  }
  else {
    local_20 = rd_local;
    local_22 = 0x693;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x693;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = uVar2;
    local_26 = uVar2;
    local_24 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
  }
  pRVar1 = rd_local;
  if ((*(int *)(*(long *)&rd_local[6].data + 8) == 0) ||
     ((*(uint *)(*(long *)&rd_local[6].data + 0xc) >> 0x18 & 0x1f) < 2)) {
    uVar3 = (undefined2)tr0;
    TVar4 = lj_ir_kgc((jit_State *)rd_local,_trsptr,IRT_STR);
    local_40 = pRVar1;
    local_42 = 0x884;
    local_46 = (undefined2)TVar4;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x884;
    *(undefined2 *)&pRVar1[7].data = uVar3;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_46;
    local_44 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    iVar5 = lj_str_haspattern(&_trsptr->str);
    if (iVar5 != 0) {
      recff_nyi((jit_State *)rd_local,_trpat);
      return;
    }
  }
  local_54 = (undefined2)trlen;
  local_50 = rd_local;
  local_52 = 0x4009;
  local_56 = (undefined2)str._4_4_;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x4009;
  *(undefined2 *)&rd_local[7].data = local_54;
  *(undefined2 *)((long)&rd_local[7].data + 2) = local_56;
  TVar4 = lj_opt_fold((jit_State *)rd_local);
  local_64 = (undefined2)tr0;
  local_60 = rd_local;
  local_62 = 0x4009;
  local_66 = (undefined2)local_108;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x4009;
  *(undefined2 *)&rd_local[7].data = local_64;
  *(undefined2 *)((long)&rd_local[7].data + 2) = local_66;
  TVar6 = lj_opt_fold((jit_State *)rd_local);
  local_74 = (undefined2)trstart;
  local_70 = rd_local;
  local_72 = 0x2a13;
  local_76 = (undefined2)str._4_4_;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x2a13;
  *(undefined2 *)&rd_local[7].data = local_74;
  *(undefined2 *)((long)&rd_local[7].data + 2) = local_76;
  TVar7 = lj_opt_fold((jit_State *)rd_local);
  local_80 = rd_local;
  local_82 = 0x4513;
  local_84 = (undefined2)tr0;
  local_86 = 0;
  *(undefined2 *)&rd_local[7].field_0x14 = 0x4513;
  *(undefined2 *)&rd_local[7].data = local_84;
  *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
  TVar8 = lj_opt_fold((jit_State *)rd_local);
  TVar6 = lj_ir_call((jit_State *)rd_local,IRCALL_lj_str_find,(ulong)TVar4,(ulong)TVar6,(ulong)TVar7
                     ,(ulong)TVar8);
  TVar7 = lj_ir_kptr_((jit_State *)rd_local,IR_KKPTR,(void *)0x0);
  pcVar9 = lj_str_find((char *)((long)&pat[1].nextgc.gcptr64 + (ulong)trpptr),
                       (char *)&(_trsptr->ud).len,pat->len - trpptr,(_trsptr->str).len);
  J_local._2_2_ = (undefined2)TVar7;
  uVar3 = (undefined2)TVar6;
  if (pcVar9 == (char *)0x0) {
    local_e0 = rd_local;
    J_local._6_2_ = 0x889;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x889;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
    J_local._4_2_ = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    **(undefined4 **)&rd_local[6].data = 0x7fff;
  }
  else {
    local_90 = rd_local;
    local_92 = 0x989;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x989;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = J_local._2_2_;
    local_96 = J_local._2_2_;
    local_94 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
    pRVar1 = rd_local;
    local_a0 = rd_local;
    local_a2 = 0x2a13;
    local_a6 = (undefined2)TVar4;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x2a13;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_a6;
    local_a4 = uVar3;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    local_b4 = (undefined2)TVar4;
    local_b0 = pRVar1;
    local_b2 = 0x2913;
    local_b6 = (undefined2)str._4_4_;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x2913;
    *(undefined2 *)&pRVar1[7].data = local_b4;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_b6;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    pRVar1 = rd_local;
    uVar3 = (undefined2)TVar4;
    TVar4 = lj_ir_kint((jit_State *)rd_local,1);
    local_c0 = pRVar1;
    local_c2 = 0x2913;
    local_c6 = (undefined2)TVar4;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x2913;
    *(undefined2 *)&pRVar1[7].data = uVar3;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_c6;
    local_c4 = uVar3;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    **(TRef **)&rd_local[6].data = TVar4;
    local_d0 = rd_local;
    local_d2 = 0x2913;
    local_d6 = (undefined2)TVar8;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x2913;
    *(undefined2 *)&rd_local[7].data = uVar3;
    *(undefined2 *)((long)&rd_local[7].data + 2) = local_d6;
    local_d4 = uVar3;
    TVar4 = lj_opt_fold((jit_State *)rd_local);
    *(TRef *)(*(long *)&rd_local[6].data + 4) = TVar4;
    _trpat->nres = 2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_find(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trpat = lj_ir_tostr(J, J->base[1]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart;
  GCstr *str = argv2str(J, &rd->argv[0]);
  GCstr *pat = argv2str(J, &rd->argv[1]);
  int32_t start;
  J->needsnap = 1;
  if (tref_isnil(J->base[2])) {
    trstart = lj_ir_kint(J, 1);
    start = 1;
  } else {
    trstart = lj_opt_narrow_toint(J, J->base[2]);
    start = argv2int(J, &rd->argv[2]);
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if ((MSize)start <= str->len) {
    emitir(IRTGI(IR_ULE), trstart, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trstart, trlen);
#if LJ_52
    J->base[0] = TREF_NIL;
    return;
#else
    trstart = trlen;
    start = str->len;
#endif
  }
  /* Fixed arg or no pattern matching chars? (Specialized to pattern string.) */
  if ((J->base[2] && tref_istruecond(J->base[3])) ||
      (emitir(IRTG(IR_EQ, IRT_STR), trpat, lj_ir_kstr(J, pat)),
       !lj_str_haspattern(pat))) {  /* Search for fixed string. */
    TRef trsptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
    TRef trpptr = emitir(IRT(IR_STRREF, IRT_PGC), trpat, tr0);
    TRef trslen = emitir(IRTI(IR_SUB), trlen, trstart);
    TRef trplen = emitir(IRTI(IR_FLOAD), trpat, IRFL_STR_LEN);
    TRef tr = lj_ir_call(J, IRCALL_lj_str_find, trsptr, trpptr, trslen, trplen);
    TRef trp0 = lj_ir_kkptr(J, NULL);
    if (lj_str_find(strdata(str)+(MSize)start, strdata(pat),
		    str->len-(MSize)start, pat->len)) {
      TRef pos;
      emitir(IRTG(IR_NE, IRT_PGC), tr, trp0);
      /* Recompute offset. trsptr may not point into trstr after folding. */
      pos = emitir(IRTI(IR_ADD), emitir(IRTI(IR_SUB), tr, trsptr), trstart);
      J->base[0] = emitir(IRTI(IR_ADD), pos, lj_ir_kint(J, 1));
      J->base[1] = emitir(IRTI(IR_ADD), pos, trplen);
      rd->nres = 2;
    } else {
      emitir(IRTG(IR_EQ, IRT_PGC), tr, trp0);
      J->base[0] = TREF_NIL;
    }
  } else {  /* Search for pattern. */
    recff_nyiu(J, rd);
    return;
  }
}